

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O2

int MetadataMultilayerEncodeTest_Test_Test::AddToRegistry(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest> *pPVar1;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_>_>
  _Var2;
  element_type *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  pointer __result;
  pointer psVar4;
  pointer psVar5;
  ulong uVar6;
  _Tp_alloc_type *__alloc;
  CodeLocation *code_location;
  pointer __first;
  ulong uVar7;
  ulong uVar8;
  allocator local_103;
  allocator local_102;
  allocator local_101;
  element_type *local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  pointer local_f0;
  string local_e8 [32];
  CodeLocation local_c8;
  string local_a0 [32];
  undefined4 local_80;
  CodeLocation local_78;
  string local_50 [32];
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::__cxx11::string::string
            (local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
             ,&local_101);
  std::__cxx11::string::string(local_a0,local_50);
  local_80 = 0x185;
  pPVar1 = testing::internal::ParameterizedTestSuiteRegistry::
           GetTestSuitePatternHolder<(anonymous_namespace)::MetadataMultilayerEncodeTest>
                     (this_00,(char *)local_a0,code_location);
  _Var2.
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_*,_false>
        )operator_new(8);
  *(undefined ***)
   _Var2.
   super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_*,_false>
   ._M_head_impl = &PTR__TestMetaFactoryBase_00f55090;
  std::__cxx11::string::string
            (local_e8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
             ,&local_102);
  std::__cxx11::string::string((string *)&local_c8,local_e8);
  local_c8.line = 0x185;
  this_01 = (element_type *)operator_new(0x70);
  testing::internal::CodeLocation::CodeLocation(&local_78,&local_c8);
  std::__cxx11::string::string((string *)this_01,"MetadataMultilayerEncodeTest",&local_103);
  std::__cxx11::string::string((string *)&this_01->test_base_name,"Test",&local_103);
  (this_01->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_>_>
  .
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_*,_false>
       = _Var2.
         super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_*,_false>
         ._M_head_impl;
  testing::internal::CodeLocation::CodeLocation(&this_01->code_location,&local_78);
  local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_100 = this_01;
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (_Var3._M_pi)->_M_use_count = 1;
  (_Var3._M_pi)->_M_weak_count = 1;
  (_Var3._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00f54fa0;
  _Var3._M_pi[1]._vptr__Sp_counted_base = (_func_int **)this_01;
  psVar5 = (pPVar1->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 == (pPVar1->tests_).
                super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = (pPVar1->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_f8._M_pi = _Var3._M_pi;
    if ((long)psVar5 - (long)__first == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar7 = (long)psVar5 - (long)__first >> 4;
    uVar6 = 1;
    if (psVar5 != __first) {
      uVar6 = uVar7;
    }
    uVar8 = uVar6 + uVar7;
    if (0x7fffffffffffffe < uVar8) {
      uVar8 = 0x7ffffffffffffff;
    }
    __alloc = (_Tp_alloc_type *)(uVar6 + uVar7);
    if (CARRY8(uVar6,uVar7)) {
      uVar8 = 0x7ffffffffffffff;
    }
    if (uVar8 == 0) {
      __result = (pointer)0x0;
    }
    else {
      local_f0 = __first;
      __result = (pointer)operator_new(uVar8 << 4);
      _Var3._M_pi = local_f8._M_pi;
      this_01 = local_100;
      __first = local_f0;
    }
    __result[uVar7].
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = this_01;
    local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __result[uVar7].
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var3._M_pi;
    local_100 = (element_type *)0x0;
    psVar4 = std::
             vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
             ::_S_relocate(__first,psVar5,__result,__alloc);
    psVar5 = std::
             vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
             ::_S_relocate(psVar5,psVar5,psVar4 + 1,__alloc);
    if (__first != (pointer)0x0) {
      operator_delete(__first);
    }
    (pPVar1->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (pPVar1->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar5;
    (pPVar1->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar8;
  }
  else {
    (psVar5->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = this_01;
    local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (psVar5->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_refcount._M_pi = _Var3._M_pi;
    local_100 = (element_type *)0x0;
    (pPVar1->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar5 + 1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_50);
  return 0;
}

Assistant:

TEST_P(MetadataMultilayerEncodeTest, Test) {
  cfg_.rc_buf_initial_sz = 500;
  cfg_.rc_buf_optimal_sz = 500;
  cfg_.rc_buf_sz = 1000;
  cfg_.g_lag_in_frames = 0;
  cfg_.g_error_resilient = 0;
  cfg_.rc_target_bitrate = 1200;

  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, /*limit=*/10);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}